

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_signal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  JSValueUnion JVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int iVar5;
  JSRuntime *pJVar6;
  void *pvVar7;
  void *pvVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  char *fmt;
  code *__handler;
  JSOSSignalHandler *sh;
  uint uVar12;
  JSValue JVar13;
  JSValue JVar14;
  uint32_t sig_num;
  uint local_3c;
  JSValueUnion local_38;
  
  pJVar6 = JS_GetRuntime(ctx);
  pvVar7 = JS_GetRuntimeOpaque(pJVar6);
  pvVar8 = JS_GetRuntimeOpaque(pJVar6);
  if (*(long *)((long)pvVar8 + 0x48) == 0) {
    iVar5 = JS_ToInt32(ctx,(int32_t *)&local_3c,*argv);
    uVar10 = 6;
    if (iVar5 == 0) {
      if (0x3f < local_3c) {
        JVar13 = JS_ThrowRangeError(ctx,"invalid signal number");
        goto LAB_00113fcc;
      }
      lVar1 = argv[1].tag;
      uVar12 = (uint)lVar1;
      if ((uVar12 & 0xfffffffe) == 2) {
        for (sh = *(JSOSSignalHandler **)((long)pvVar7 + 0x18);
            sh != (JSOSSignalHandler *)((long)pvVar7 + 0x10);
            sh = (JSOSSignalHandler *)(sh->link).next) {
          if (sh->sig_num == local_3c) goto LAB_00114121;
        }
        sh = (JSOSSignalHandler *)0x0;
LAB_00114121:
        if (sh != (JSOSSignalHandler *)0x0) {
          pJVar6 = JS_GetRuntime(ctx);
          free_sh(pJVar6,sh);
        }
        __handler = (code *)(ulong)(uVar12 != 2);
      }
      else {
        JVar2 = (JSValueUnion)argv[1].u.ptr;
        JVar13.tag = lVar1;
        JVar13.u.ptr = JVar2.ptr;
        iVar5 = JS_IsFunction(ctx,JVar13);
        if (iVar5 == 0) {
          fmt = "not a function";
          goto LAB_00113fc2;
        }
        plVar11 = (long *)((long)pvVar7 + 0x10);
        for (plVar9 = *(long **)((long)pvVar7 + 0x18); plVar9 != plVar11; plVar9 = (long *)plVar9[1]
            ) {
          if (*(uint *)(plVar9 + 2) == local_3c) goto LAB_001140ad;
        }
        plVar9 = (long *)0x0;
LAB_001140ad:
        if (plVar9 == (long *)0x0) {
          plVar9 = (long *)js_mallocz(ctx,0x28);
          if (plVar9 == (long *)0x0) goto LAB_00113ffe;
          *(uint *)(plVar9 + 2) = local_3c;
          lVar3 = *plVar11;
          *(long **)(lVar3 + 8) = plVar9;
          *plVar9 = lVar3;
          plVar9[1] = (long)plVar11;
          *plVar11 = (long)plVar9;
        }
        JS_FreeValue(ctx,*(JSValue *)(plVar9 + 3));
        if (0xfffffff4 < uVar12) {
          *(int *)JVar2.ptr = *JVar2.ptr + 1;
        }
        ((JSValueUnion *)(plVar9 + 3))->ptr = (void *)JVar2;
        plVar9[4] = lVar1;
        __handler = os_signal_handler;
        local_38 = JVar2;
      }
      signal(local_3c,__handler);
      uVar10 = 3;
    }
LAB_00113ffe:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    JVar13 = (JSValue)(auVar4 << 0x40);
    uVar10 = 0;
  }
  else {
    fmt = "signal handler can only be set in the main thread";
LAB_00113fc2:
    JVar13 = JS_ThrowTypeError(ctx,fmt);
LAB_00113fcc:
    uVar10 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
  }
  JVar14.u.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar10);
  JVar14.tag = JVar13.tag;
  return JVar14;
}

Assistant:

static JSValue js_os_signal(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSSignalHandler *sh;
    uint32_t sig_num;
    JSValueConst func;
    sighandler_t handler;

    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "signal handler can only be set in the main thread");
    
    if (JS_ToUint32(ctx, &sig_num, argv[0]))
        return JS_EXCEPTION;
    if (sig_num >= 64)
        return JS_ThrowRangeError(ctx, "invalid signal number");
    func = argv[1];
    /* func = null: SIG_DFL, func = undefined, SIG_IGN */
    if (JS_IsNull(func) || JS_IsUndefined(func)) {
        sh = find_sh(ts, sig_num);
        if (sh) {
            free_sh(JS_GetRuntime(ctx), sh);
        }
        if (JS_IsNull(func))
            handler = SIG_DFL;
        else
            handler = SIG_IGN;
        signal(sig_num, handler);
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        sh = find_sh(ts, sig_num);
        if (!sh) {
            sh = js_mallocz(ctx, sizeof(*sh));
            if (!sh)
                return JS_EXCEPTION;
            sh->sig_num = sig_num;
            list_add_tail(&sh->link, &ts->os_signal_handlers);
        }
        JS_FreeValue(ctx, sh->func);
        sh->func = JS_DupValue(ctx, func);
        signal(sig_num, os_signal_handler);
    }
    return JS_UNDEFINED;
}